

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O3

ON_Outline * __thiscall ON_OutlineAccumulator::Internal_Outline(ON_OutlineAccumulator *this)

{
  uint uVar1;
  ON_2dex OVar2;
  ON_2dex OVar3;
  ON_2dex OVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ON_Outline *pOVar10;
  
  if (*(ON_Outline **)(this + 0x50) != (ON_Outline *)0x0) {
    return *(ON_Outline **)(this + 0x50);
  }
  pOVar10 = (ON_Outline *)operator_new(0x78);
  pOVar10->m_units_per_em = 0;
  pOVar10->m_figure_type = Unset;
  pOVar10->m_bbox_status = '\0';
  pOVar10->m_sorted_figure_outer_orientation = Unset;
  pOVar10->m_reserved1 = '\0';
  pOVar10->m_short_tolerance = 0.0;
  dVar9 = ON_BoundingBox::NanBoundingBox.m_max.z;
  dVar8 = ON_BoundingBox::NanBoundingBox.m_max.y;
  dVar7 = ON_BoundingBox::NanBoundingBox.m_max.x;
  dVar6 = ON_BoundingBox::NanBoundingBox.m_min.z;
  dVar5 = ON_BoundingBox::NanBoundingBox.m_min.y;
  (pOVar10->m_bbox).m_min.x = ON_BoundingBox::NanBoundingBox.m_min.x;
  (pOVar10->m_bbox).m_min.y = dVar5;
  (pOVar10->m_bbox).m_min.z = dVar6;
  (pOVar10->m_bbox).m_max.x = dVar7;
  (pOVar10->m_bbox).m_max.y = dVar8;
  (pOVar10->m_bbox).m_max.z = dVar9;
  OVar4 = ON_TextBox::Unset.m_advance;
  OVar3 = ON_TextBox::Unset.m_bbmax;
  OVar2 = ON_TextBox::Unset.m_bbmin;
  (pOVar10->m_glyph_metrics).m_max_basepoint = ON_TextBox::Unset.m_max_basepoint;
  (pOVar10->m_glyph_metrics).m_advance = OVar4;
  (pOVar10->m_glyph_metrics).m_bbmin = OVar2;
  (pOVar10->m_glyph_metrics).m_bbmax = OVar3;
  (pOVar10->m_figures)._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_0080fc80;
  (pOVar10->m_figures).m_a = (ON_OutlineFigure *)0x0;
  (pOVar10->m_figures).m_count = 0;
  (pOVar10->m_figures).m_capacity = 0;
  *(ON_Outline **)(this + 0x50) = pOVar10;
  uVar1 = *(uint *)this;
  pOVar10->m_units_per_em = uVar1;
  if (uVar1 != 0) {
    pOVar10->m_short_tolerance = (double)uVar1 / 2056.0;
  }
  return pOVar10;
}

Assistant:

ON_Outline& ON_OutlineAccumulator::Internal_Outline()
{
  if (nullptr == m_outline)
  {
    m_outline = new ON_Outline();
    m_outline->SetUnitsPerEM(m_units_per_em);
  }
  return *m_outline;
}